

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpLineAndFile.hpp
# Opt level: O1

void __thiscall GrpLineAndFile::GrpLineAndFile(GrpLineAndFile *this,GrpLineAndFile *lnf)

{
  int iVar1;
  
  (this->m_staFile)._M_dataplus._M_p = (pointer)&(this->m_staFile).field_2;
  (this->m_staFile)._M_string_length = 0;
  (this->m_staFile).field_2._M_local_buf[0] = '\0';
  iVar1 = lnf->m_nLineOrig;
  this->m_nLinePre = lnf->m_nLinePre;
  this->m_nLineOrig = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->m_staFile);
  return;
}

Assistant:

GrpLineAndFile(const GrpLineAndFile & lnf)
	{
		m_nLinePre = lnf.m_nLinePre;
		m_nLineOrig = lnf.m_nLineOrig;
		m_staFile = lnf.m_staFile;
	}